

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EcMasterlibMain.cpp
# Opt level: O2

EC_T_DWORD EnableRealtimeEnvironment(void)

{
  int iVar1;
  char *__s;
  int nSub;
  sched_param schedParam;
  int nMin;
  int nMaj;
  timespec ts;
  utsname SystemName;
  
  iVar1 = uname((utsname *)&SystemName);
  if (iVar1 == 0) {
    __isoc99_sscanf(SystemName.release,"%d.%d.%d",&nMaj,&nMin,&nSub);
    if ((nMaj < 3) && (nMin != 6 || nMaj != 2)) {
      printf("ERROR - detected kernel = %d.%d.%d, required Linux kernel >= 2.6\n",(ulong)(uint)nMaj,
             (ulong)(uint)nMin,(ulong)(uint)nSub);
      return 0x98110000;
    }
    schedParam.sched_priority = 0x27;
    iVar1 = sched_setscheduler(0,1,(sched_param *)&schedParam);
    if (iVar1 == -1) {
      __s = 
      "ERROR - cannot change scheduling policy!\nroot privilege is required or realtime group has to be joined!"
      ;
    }
    else {
      iVar1 = mlockall(3);
      if (iVar1 != -1) {
        iVar1 = clock_getres(1,(timespec *)&ts);
        if (((iVar1 != 0) || (ts.tv_sec != 0)) || (ts.tv_nsec != 1)) {
          puts("WARNING: High resolution timers not available");
        }
        OsSleepSetType(2);
        return 0;
      }
      __s = "ERROR - cannot disable paging!";
    }
  }
  else {
    __s = "ERROR calling uname(), required Linux kernel >= 2.6";
  }
  puts(__s);
  return 0x98110000;
}

Assistant:

EC_T_DWORD EnableRealtimeEnvironment( EC_T_VOID )
{
   struct utsname SystemName;
   int nMaj, nMin, nSub;
   struct timespec ts;
   int nRetval;
   EC_T_DWORD dwResult = EC_E_ERROR;
   EC_T_BOOL bHighResTimerAvail;
   struct sched_param schedParam;

   /* master only tested on >= 2.6 kernel */
   nRetval = uname( &SystemName );
   if (nRetval != 0)
   {
      OsPrintf( "ERROR calling uname(), required Linux kernel >= 2.6\n" );
      dwResult = EC_E_ERROR;
      goto Exit;
   }
   sscanf( SystemName.release, "%d.%d.%d", &nMaj, &nMin, &nSub );
   if (!(((nMaj == 2) && (nMin == 6)) || (nMaj >= 3)))
   {
      OsPrintf( "ERROR - detected kernel = %d.%d.%d, required Linux kernel >= 2.6\n", nMaj, nMin, nSub );
      dwResult = EC_E_ERROR;
      goto Exit;
   }

   /* request realtime scheduling for the current process
    * This value is overwritten for each individual task
    */
   schedParam.sched_priority = MAIN_THREAD_PRIO; /* 1 lowest priority, 99 highest priority */
   nRetval = sched_setscheduler( 0, SCHED_FIFO, &schedParam );
   if (nRetval == -1)
   {
      OsPrintf( "ERROR - cannot change scheduling policy!\n"
                "root privilege is required or realtime group has to be joined!\n" );
      goto Exit;
   }

   /* disable paging */
   nRetval = mlockall( MCL_CURRENT | MCL_FUTURE );
   if (nRetval == -1)
   {
      OsPrintf( "ERROR - cannot disable paging!\n" );
      dwResult = EC_E_ERROR;
      goto Exit;
   }

   /* check if high resolution timers are available */
   if (clock_getres(CLOCK_MONOTONIC, &ts))
   {
      bHighResTimerAvail = EC_FALSE;
   }
   else
   {
      bHighResTimerAvail = !(ts.tv_sec != 0 || ts.tv_nsec != 1);
   }
   if( !bHighResTimerAvail )
   {
      OsPrintf( "WARNING: High resolution timers not available\n" );
   }

   /* set type of OsSleep implementation  (eSLEEP_USLEEP, eSLEEP_NANOSLEEP or eSLEEP_CLOCK_NANOSLEEP) */
   OsSleepSetType( eSLEEP_CLOCK_NANOSLEEP );

   dwResult = EC_E_NOERROR;
Exit:
    return dwResult;
}